

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O1

void __thiscall
PersistentStorageJsonTestSuite_UpdRegistrar_Test::TestBody
          (PersistentStorageJsonTestSuite_UpdRegistrar_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  pointer pcVar4;
  long lVar5;
  undefined8 *puVar6;
  pointer pbVar7;
  size_type sVar8;
  _Alloc_hider _Var9;
  Status SVar10;
  int iVar11;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__4;
  RegistrarId newId;
  Registrar returnValue;
  Registrar newValue;
  PersistentStorageJson psj;
  AssertHelper AStack_158;
  AssertHelper local_150;
  undefined8 *local_148;
  allocator_type local_139;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegistrarId local_fc;
  Registrar local_f8;
  Registrar local_b0;
  PersistentStorageJson local_68;
  
  unlink("./tmp/test.tmp");
  pcVar3 = (char *)((long)&local_b0 + 0x10);
  local_b0._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&local_68,(string *)&local_b0);
  if ((char *)local_b0._0_8_ != pcVar3) {
    operator_delete((void *)local_b0._0_8_);
  }
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&local_68);
  local_f8.mId.mId._0_1_ = SVar10 == kSuccess;
  local_f8.mAddr._M_dataplus._M_p = (pointer)0x0;
  if (SVar10 != kSuccess) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_f8,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1af,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_138,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_138);
    if ((char *)local_b0._0_8_ != pcVar3) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_120._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_120._M_dataplus._M_p + 8))();
    }
  }
  _Var9._M_p = local_f8.mAddr._M_dataplus._M_p;
  if (local_f8.mAddr._M_dataplus._M_p != (pointer)0x0) {
    if (*local_f8.mAddr._M_dataplus._M_p != local_f8.mAddr._M_dataplus._M_p + 0x10) {
      operator_delete(*local_f8.mAddr._M_dataplus._M_p);
    }
    operator_delete(_Var9._M_p);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_fc);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&AStack_158,0xffffffff);
  lVar5 = (long)&local_f8 + 0x10;
  local_f8._0_8_ = lVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"0.0.0.1","");
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dom1","");
  __l._M_len = 1;
  __l._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l,&local_139);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,(RegistrarId *)&AStack_158,(string *)&local_f8,1,&local_138);
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                     (&local_68,&local_b0,&local_fc);
  local_150.data_._0_1_ = (internal)(SVar10 == kSuccess);
  local_148 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  pcVar4 = (pointer)((long)&local_b0 + 0x18);
  if (local_b0.mAddr._M_dataplus._M_p != pcVar4) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_f8._0_8_ != lVar5) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (local_150.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_150,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.1\", 1, {\"dom1\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b4,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((char *)local_b0._0_8_ != pcVar3) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  puVar6 = local_148;
  if (local_148 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_148 != local_148 + 2) {
      operator_delete((undefined8 *)*local_148);
    }
    operator_delete(puVar6);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&AStack_158,0xffffffff);
  local_f8._0_8_ = lVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"0.0.0.2","");
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dom2","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_00,&local_139);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,(RegistrarId *)&AStack_158,(string *)&local_f8,2,&local_138);
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                     (&local_68,&local_b0,&local_fc);
  local_150.data_._0_1_ = (internal)(SVar10 == kSuccess);
  local_148 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != pcVar4) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_f8._0_8_ != lVar5) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (local_150.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_150,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.2\", 2, {\"dom2\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b5,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((char *)local_b0._0_8_ != pcVar3) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  puVar6 = local_148;
  if (local_148 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_148 != local_148 + 2) {
      operator_delete((undefined8 *)*local_148);
    }
    operator_delete(puVar6);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&AStack_158,0xffffffff);
  local_f8._0_8_ = lVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"0.0.0.3","");
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dom3","");
  __l_01._M_len = 1;
  __l_01._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_01,&local_139);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,(RegistrarId *)&AStack_158,(string *)&local_f8,3,&local_138);
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Add
                     (&local_68,&local_b0,&local_fc);
  local_150.data_._0_1_ = (internal)(SVar10 == kSuccess);
  local_148 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != pcVar4) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_f8._0_8_ != lVar5) {
    operator_delete((void *)local_f8._0_8_);
  }
  if (local_150.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_b0,(internal *)&local_150,
               (AssertionResult *)
               "psj.Add(Registrar{EMPTY_ID, \"0.0.0.3\", 3, {\"dom3\"}}, newId) == PersistentStorage::Status::kSuccess"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1b6,(char *)local_b0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if ((char *)local_b0._0_8_ != pcVar3) {
      operator_delete((void *)local_b0._0_8_);
    }
    if ((long *)local_f8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  puVar6 = local_148;
  if (local_148 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_148 != local_148 + 2) {
      operator_delete((undefined8 *)*local_148);
    }
    operator_delete(puVar6);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId
            ((RegistrarId *)&local_150,0xffffffff);
  local_f8._0_8_ = lVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"4.4.4.4","");
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dom4","");
  __l_02._M_len = 1;
  __l_02._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_02,(allocator_type *)&AStack_158);
  ot::commissioner::persistent_storage::Registrar::Registrar
            (&local_b0,(RegistrarId *)&local_150,(string *)&local_f8,1,&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_f8._0_8_ != lVar5) {
    operator_delete((void *)local_f8._0_8_);
  }
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Update(&local_68,&local_b0);
  local_120._M_dataplus._M_p._0_1_ = SVar10 == kNotFound;
  local_120._M_string_length = 0;
  if (SVar10 != kNotFound) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f8,(internal *)&local_120,
               (AssertionResult *)"psj.Update(newValue) == PersistentStorage::Status::kNotFound",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1bb,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_f8._0_8_ != lVar5) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((long *)CONCAT71(local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_120._M_string_length;
  if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_120._M_string_length !=
        (undefined8 *)(local_120._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_120._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId(&local_f8.mId,2);
  local_b0.mId.mId = local_f8.mId.mId;
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Update(&local_68,&local_b0);
  local_120._M_dataplus._M_p._0_1_ = SVar10 == kSuccess;
  local_120._M_string_length = 0;
  if (SVar10 != kSuccess) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_f8,(internal *)&local_120,
               (AssertionResult *)"psj.Update(newValue) == PersistentStorage::Status::kSuccess",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1bd,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    if (local_f8._0_8_ != lVar5) {
      operator_delete((void *)local_f8._0_8_);
    }
    if ((long *)CONCAT71(local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  sVar8 = local_120._M_string_length;
  if ((undefined8 *)local_120._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_120._M_string_length !=
        (undefined8 *)(local_120._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_120._M_string_length);
    }
    operator_delete((void *)sVar8);
  }
  ot::commissioner::persistent_storage::Registrar::Registrar(&local_f8);
  ot::commissioner::persistent_storage::RegistrarId::RegistrarId((RegistrarId *)&local_120,2);
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                     (&local_68,(RegistrarId *)&local_120,&local_f8);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)(SVar10 == kSuccess);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_138,
               (AssertionResult *)
               "psj.Get(RegistrarId(2), returnValue) == PersistentStorage::Status::kSuccess","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c1,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
    }
  }
  pbVar7 = local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar7);
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)(local_f8.mId.mId == 2);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_138,(AssertionResult *)"returnValue.mId.mId == 2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c2,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
    }
  }
  pbVar7 = local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar7);
  }
  iVar11 = std::__cxx11::string::compare((char *)((long)&local_f8 + 8));
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)(iVar11 == 0);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_138,
               (AssertionResult *)"returnValue.mAddr == \"4.4.4.4\"","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c3,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
    }
  }
  pbVar7 = local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar7);
  }
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)(local_f8.mPort == 1);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_138,(AssertionResult *)"returnValue.mPort == 1","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c4,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
    }
  }
  pbVar7 = local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar7);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dom4","");
  __l_03._M_len = 1;
  __l_03._M_array = &local_120;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l_03,(allocator_type *)&AStack_158);
  if ((long)local_f8.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_f8.mDomains.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
      (long)local_138.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)CONCAT71(local_138.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                     local_138.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_1_)) {
    local_150.data_._0_1_ =
         (internal)
         std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                   (local_f8.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    local_f8.mDomains.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                             local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  else {
    local_150.data_._0_1_ = (internal)0x0;
  }
  local_148 = (undefined8 *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if (local_150.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_150,
               (AssertionResult *)"returnValue.mDomains == std::vector<std::string>{\"dom4\"}",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c5,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_138.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_138.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  puVar6 = local_148;
  if (local_148 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_148 != local_148 + 2) {
      operator_delete((undefined8 *)*local_148);
    }
    operator_delete(puVar6);
  }
  SVar10 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&local_68);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = (internal)(SVar10 == kSuccess);
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_138,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x1c7,local_120._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_158,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&AStack_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if ((long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_150.data_._1_7_,local_150.data_._0_1_) + 8))();
    }
  }
  pbVar7 = local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    pcVar2 = ((local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 !=
        &(local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pbVar7);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8.mDomains);
  if (local_f8.mAddr._M_dataplus._M_p != (pointer)((long)&local_f8 + 0x18U)) {
    operator_delete(local_f8.mAddr._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.mDomains);
  if (local_b0.mAddr._M_dataplus._M_p != pcVar4) {
    operator_delete(local_b0.mAddr._M_dataplus._M_p);
  }
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&local_68);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, UpdRegistrar)
{
    // Make the test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    // Add initial data
    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 2, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);

    // Test actions
    Registrar newValue{EMPTY_ID, "4.4.4.4", 1, {"dom4"}};

    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kNotFound);
    newValue.mId = 2;
    EXPECT_TRUE(psj.Update(newValue) == PersistentStorage::Status::kSuccess);

    Registrar returnValue;

    EXPECT_TRUE(psj.Get(RegistrarId(2), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 2);
    EXPECT_TRUE(returnValue.mAddr == "4.4.4.4");
    EXPECT_TRUE(returnValue.mPort == 1);
    EXPECT_TRUE(returnValue.mDomains == std::vector<std::string>{"dom4"});

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}